

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O1

int SZIP_stat(void *opaque,char *path,PHYSFS_Stat *stat)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  pvVar2 = __PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,path);
  if (pvVar2 == (void *)0x0) {
    iVar1 = 0;
  }
  else {
    uVar6 = (ulong)*(uint *)((long)pvVar2 + 0x28);
    bVar7 = *(int *)((long)pvVar2 + 0x20) == 0;
    if (bVar7) {
      lVar3 = *(long *)(*(long *)((long)opaque + 0x90) +
                       (ulong)(*(uint *)((long)pvVar2 + 0x28) + 1) * 8) -
              *(long *)(*(long *)((long)opaque + 0x90) + uVar6 * 8);
    }
    else {
      lVar3 = -1;
    }
    stat->filesize = lVar3;
    stat->filetype = (uint)!bVar7;
    lVar3 = *(long *)((long)opaque + 200);
    lVar4 = lVar3;
    if ((lVar3 == 0) && (lVar4 = *(long *)((long)opaque + 0xd8), lVar4 == 0)) {
      uVar5 = 0xffffffffffffffff;
    }
    else {
      uVar5 = (*(long *)(lVar4 + uVar6 * 8) + 0xfe624e212ac18000U) / 10000000;
    }
    stat->modtime = uVar5;
    lVar4 = *(long *)((long)opaque + 0xd8);
    uVar5 = 0xffffffffffffffff;
    if (lVar4 != 0 || lVar3 != 0) {
      if (lVar4 != 0) {
        lVar3 = lVar4;
      }
      uVar5 = (*(long *)(lVar3 + uVar6 * 8) + 0xfe624e212ac18000U) / 10000000;
    }
    stat->createtime = uVar5;
    stat->accesstime = -1;
    stat->readonly = 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int SZIP_stat(void *opaque, const char *path, PHYSFS_Stat *stat)
{
    SZIPinfo *info = (SZIPinfo *) opaque;
    SZIPentry *entry;
    PHYSFS_uint32 idx;

    entry = (SZIPentry *) __PHYSFS_DirTreeFind(&info->tree, path);
    BAIL_IF_ERRPASS(!entry, 0);
    idx = entry->dbidx;

    if (entry->tree.isdir)
    {
        stat->filesize = -1;
	    stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
    } /* if */
    else
    {
        stat->filesize = (PHYSFS_sint64) SzArEx_GetFileSize(&info->db, idx);
	    stat->filetype = PHYSFS_FILETYPE_REGULAR;
    } /* else */

    if (info->db.MTime.Vals != NULL)
	    stat->modtime = lzmasdkTimeToPhysfsTime(&info->db.MTime.Vals[idx]);
    else if (info->db.CTime.Vals != NULL)
	    stat->modtime = lzmasdkTimeToPhysfsTime(&info->db.CTime.Vals[idx]);
    else
	    stat->modtime = -1;

    if (info->db.CTime.Vals != NULL)
	    stat->createtime = lzmasdkTimeToPhysfsTime(&info->db.CTime.Vals[idx]);
    else if (info->db.MTime.Vals != NULL)
	    stat->createtime = lzmasdkTimeToPhysfsTime(&info->db.MTime.Vals[idx]);
    else
	    stat->createtime = -1;

	stat->accesstime = -1;
	stat->readonly = 1;

    return 1;
}